

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

void Curl_shutdown_start(Curl_easy *data,int sockindex,curltime *nowp)

{
  curltime *pcVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  curltime cVar6;
  curltime local_20;
  
  if (nowp == (curltime *)0x0) {
    cVar6 = Curl_now();
    nowp = &local_20;
    local_20.tv_sec = cVar6.tv_sec;
    local_20.tv_usec = cVar6.tv_usec;
  }
  iVar3 = nowp->tv_usec;
  uVar4 = *(undefined4 *)&nowp->field_0xc;
  pcVar1 = (data->conn->shutdown).start + sockindex;
  pcVar1->tv_sec = nowp->tv_sec;
  pcVar1->tv_usec = iVar3;
  *(undefined4 *)&pcVar1->field_0xc = uVar4;
  uVar2 = (data->set).shutdowntimeout;
  uVar5 = 2000;
  if (uVar2 != 0) {
    uVar5 = uVar2;
  }
  (data->conn->shutdown).timeout_ms = uVar5;
  return;
}

Assistant:

void Curl_shutdown_start(struct Curl_easy *data, int sockindex,
                         struct curltime *nowp)
{
  struct curltime now;

  DEBUGASSERT(data->conn);
  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }
  data->conn->shutdown.start[sockindex] = *nowp;
  data->conn->shutdown.timeout_ms = (data->set.shutdowntimeout > 0) ?
    data->set.shutdowntimeout : DEFAULT_SHUTDOWN_TIMEOUT_MS;
}